

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::MutableRepeatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  byte bVar1;
  uint32_t uVar2;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  MessageLite *pMVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *pVVar4;
  Nonnull<const_char_*> pcVar5;
  bool bVar6;
  char *description;
  Descriptor *pDVar7;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  if (MVar8.reflection != this) {
    pDVar7 = this->descriptor_;
    MVar8 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar7,MVar8.descriptor,field,"MutableRepeatedMessage");
  }
  pDVar7 = this->descriptor_;
  if (field->containing_type_ == pDVar7) {
    bVar1 = field->field_0x1;
    bVar6 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar6) {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar6,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar5 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"MutableRepeatedMessage",CPPTYPE_MESSAGE);
        }
        if ((field->field_0x1 & 8) != 0) {
          uVar2 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          pMVar3 = protobuf::internal::ExtensionSet::MutableRepeatedMessage
                             ((ExtensionSet *)
                              ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2)
                              ,field->number_,index);
          return (Message *)pMVar3;
        }
        if (field->type_ == '\v') {
          bVar6 = FieldDescriptor::is_map_message_type(field);
          if (bVar6) {
            VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
            this_00 = (MapFieldBase *)MutableRawImpl(this,message,field);
            this_01 = protobuf::internal::MapFieldBase::MutableRepeatedField(this_00);
            goto LAB_00fa3c51;
          }
        }
        VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(this,field);
        this_01 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
LAB_00fa3c51:
        pVVar4 = protobuf::internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                           (this_01,index);
        return pVVar4;
      }
    }
    else {
      MutableRepeatedMessage();
    }
    pDVar7 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar7,field,"MutableRepeatedMessage",description);
}

Assistant:

Message* Reflection::MutableRepeatedMessage(Message* message,
                                            const FieldDescriptor* field,
                                            int index) const {
  USAGE_MUTABLE_CHECK_ALL(MutableRepeatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableRepeatedMessage(field->number(),
                                                             index));
  } else {
    if (IsMapFieldInApi(field)) {
      return MutableRaw<MapFieldBase>(message, field)
          ->MutableRepeatedField()
          ->Mutable<GenericTypeHandler<Message> >(index);
    } else {
      return MutableRaw<RepeatedPtrFieldBase>(message, field)
          ->Mutable<GenericTypeHandler<Message> >(index);
    }
  }
}